

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

bool ReadBufData(void)

{
  const_iterator cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  byte *__s2;
  char *pcVar5;
  long lVar6;
  
  if (0x7fd < (long)(rlppos + -0x18aa20)) {
    Error("Line too long",(char *)0x0,FATAL);
  }
  if (rlpbuf < rlpbuf_end) {
    return true;
  }
  if ((_stdin == FP_Input) && (pass != 1)) {
LAB_00127f90:
    rlpbuf = rlbuf;
    if (_stdin != FP_Input) goto LAB_00127fcb;
  }
  else {
    iVar2 = feof((FILE *)FP_Input);
    if (iVar2 != 0) {
      return false;
    }
    if (pass != 1) goto LAB_00127f90;
LAB_00127fcb:
    rlpbuf = rlbuf;
    sVar3 = fread(rlbuf,1,0x1000,(FILE *)FP_Input);
    rlpbuf_end = rlbuf + sVar3;
    rlbuf[sVar3] = '\0';
    if (_stdin != FP_Input) goto LAB_00128093;
  }
  if (pass == 1) {
    if (rlpbuf_end <= rlpbuf) goto LAB_00128093;
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)stdin_log,
               (const_iterator)
               (stdin_log->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish,rlpbuf,rlpbuf_end);
  }
  pcVar5 = rlpbuf;
  cVar1._M_current = stdin_read_it._M_current;
  if (1 < pass) {
    rlpbuf_end = rlpbuf;
    uVar4 = (long)(stdin_log->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)stdin_read_it._M_current;
    if (0 < (long)uVar4) {
      sVar3 = 8000;
      if (uVar4 < 8000) {
        sVar3 = uVar4;
      }
      memcpy(rlbuf,stdin_read_it._M_current,sVar3);
      stdin_read_it._M_current = cVar1._M_current + sVar3;
      rlpbuf_end = pcVar5 + sVar3;
    }
    *rlpbuf_end = '\0';
  }
LAB_00128093:
  if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].line == 0) {
      __s2 = UtfBomMarkers[0].marker;
      for (lVar6 = 0; pcVar5 = rlpbuf, lVar6 != -200; lVar6 = lVar6 + -0x28) {
        sVar3 = *(size_t *)(__s2 + -8);
        if ((rlpbuf + sVar3 <= rlpbuf_end) && (iVar2 = bcmp(rlpbuf,__s2,sVar3), iVar2 == 0)) {
          if (lVar6 != 0) {
            Error("Invalid UTF encoding detected (only ASCII and UTF8 works)",(char *)(__s2 + -0x18)
                  ,FATAL);
            pcVar5 = rlpbuf;
          }
          rlpbuf = pcVar5 + sVar3;
        }
        __s2 = __s2 + 0x28;
      }
    }
    return rlpbuf < rlpbuf_end;
  }
  __assert_fail("!sourcePosStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                ,0x2c6,"bool ReadBufData()");
}

Assistant:

static bool ReadBufData() {
	// check here also if `line` buffer is not full
	if ((LINEMAX-2) <= (rlppos - line)) Error("Line too long", NULL, FATAL);
	// now check for read data
	if (rlpbuf < rlpbuf_end) return 1;		// some data still in buffer
	// check EOF on files in every pass, stdin only in first, following will starve the stdin_log
	if ((stdin != FP_Input || 1 == pass) && feof(FP_Input)) return 0;	// no more data in file
	// read next block of data
	rlpbuf = rlbuf;
	// handle STDIN file differently (pass1 = read it, pass2+ replay "log" variable)
	if (1 == pass || stdin != FP_Input) {	// ordinary file is re-read every pass normally
		rlpbuf_end = rlbuf + fread(rlbuf, 1, 4096, FP_Input);
		*rlpbuf_end = 0;					// add zero terminator after new block
	}
	if (stdin == FP_Input) {
		// store copy of stdin into stdin_log during pass 1
		if (1 == pass && rlpbuf < rlpbuf_end) {
			stdin_log->insert(stdin_log->end(), rlpbuf, rlpbuf_end);
		}
		// replay the log in 2nd+ pass
		if (1 < pass) {
			rlpbuf_end = rlpbuf;
			long toCopy = std::min(8000L, (long)std::distance(stdin_read_it, stdin_log->cend()));
			if (0 < toCopy) {
				memcpy(rlbuf, &(*stdin_read_it), toCopy);
				stdin_read_it += toCopy;
				rlpbuf_end += toCopy;
			}
			*rlpbuf_end = 0;				// add zero terminator after new block
		}
	}
	// check UTF BOM markers only at the beginning of the file (source line == 0)
	assert(!sourcePosStack.empty());
	if (sourcePosStack.back().line) {
		return (rlpbuf < rlpbuf_end);		// return true if some data were read
	}
	//UTF BOM markers detector
	for (const auto & bomMarkerData : UtfBomMarkers) {
		if (rlpbuf_end < (rlpbuf + bomMarkerData.length)) continue;	// not enough bytes in buffer
		if (memcmp(rlpbuf, bomMarkerData.marker, bomMarkerData.length)) continue;	// marker not found
		if (&bomMarkerData != UtfBomMarkers) {	// UTF8 is first in the array, other markers show error
			Error("Invalid UTF encoding detected (only ASCII and UTF8 works)", bomMarkerData.name, FATAL);
		}
		rlpbuf += bomMarkerData.length;	// skip the UTF8 BOM marker
	}
	return (rlpbuf < rlpbuf_end);			// return true if some data were read
}